

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void __thiscall QApplicationPrivate::handlePaletteChanged(QApplicationPrivate *this,char *className)

{
  QObject *pQVar1;
  QGraphicsScene **ppQVar2;
  QWidget **ppQVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QList<QWidget_*> local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((char)QCoreApplicationPrivate::is_app_running == '\x01') &&
     ((char)QCoreApplicationPrivate::is_app_closing == '\0')) {
    if ((className == (char *)0x0) &&
       ((widgetPalettes.d != (Data *)0x0 && ((widgetPalettes.d)->size != 0)))) {
      QHash<QByteArray,_QPalette>::clear(&widgetPalettes);
    }
    QGuiApplicationPrivate::handlePaletteChanged((char *)this);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,ApplicationPaletteChange);
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    if (QWidgetPrivate::allWidgets == (QWidgetSet *)0x0) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (QWidget **)0x0;
      local_68.d.size = 0;
    }
    else {
      QSet<QWidget_*>::values(&local_68,QWidgetPrivate::allWidgets);
    }
    ppQVar3 = local_68.d.ptr;
    if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
      lVar5 = local_68.d.size << 3;
      lVar6 = 0;
      do {
        pQVar1 = *(QObject **)((long)ppQVar3 + lVar6);
        if ((*(byte *)(*(long *)(pQVar1 + 0x20) + 0xc) & 1) == 0) {
          lVar4 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,className);
          if (lVar4 != 0) {
            QCoreApplication::sendEvent(pQVar1,(QEvent *)&local_48);
          }
        }
        lVar6 = lVar6 + 8;
      } while (lVar5 != lVar6);
    }
    lVar5 = (this->scene_list).d.size;
    if (lVar5 != 0) {
      ppQVar2 = (this->scene_list).d.ptr;
      lVar6 = 0;
      do {
        QCoreApplication::sendEvent(*(QObject **)((long)ppQVar2 + lVar6),(QEvent *)&local_48);
        lVar6 = lVar6 + 8;
      } while (lVar5 << 3 != lVar6);
    }
    if ((className == (char *)0x0) && ((QCoreApplicationPrivate::attribs._2_1_ & 8) == 0)) {
      initializeWidgetPalettesFromTheme();
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
      }
    }
    QEvent::~QEvent((QEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::handlePaletteChanged(const char *className)
{
    if (!is_app_running || is_app_closing)
        return;

    // Setting the global application palette is documented to
    // reset any previously set class specific widget palettes.
    if (!className && !widgetPalettes.isEmpty())
        widgetPalettes.clear();

    QGuiApplicationPrivate::handlePaletteChanged(className);

    QEvent event(QEvent::ApplicationPaletteChange);
    const QWidgetList widgets = QApplication::allWidgets();
    for (auto widget : widgets) {
        if (!widget->isWindow() && widget->inherits(className))
            QCoreApplication::sendEvent(widget, &event);
    }

#if QT_CONFIG(graphicsview)
    for (auto scene : std::as_const(scene_list))
        QCoreApplication::sendEvent(scene, &event);
#endif

    // Palette has been reset back to the default application palette,
    // so we need to reinitialize the widget palettes from the theme.
    if (!className && !testAttribute(Qt::AA_SetPalette))
        initializeWidgetPalettesFromTheme();
}